

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_SaveState(int id)

{
  mapped_type *pmVar1;
  int i;
  mapped_type *dst;
  key_type *in_stack_00000028;
  map<int,_State,_std::less<int>,_std::allocator<std::pair<const_int,_State>_>_> *in_stack_00000030;
  int local_14;
  
  pmVar1 = std::map<int,_State,_std::less<int>,_std::allocator<std::pair<const_int,_State>_>_>::
           operator[](in_stack_00000030,in_stack_00000028);
  pmVar1->Window = g_Window;
  pmVar1->Time = g_Time;
  pmVar1->MousePressed[0] = (bool)(g_MousePressed[0] & 1);
  pmVar1->MousePressed[1] = (bool)(g_MousePressed[1] & 1);
  pmVar1->MousePressed[2] = (bool)(g_MousePressed[2] & 1);
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    pmVar1->MouseCursors[local_14] = g_MouseCursors[local_14];
  }
  pmVar1->ClipboardTextData = g_ClipboardTextData;
  pmVar1->MouseCanUseGlobalState = (bool)(g_MouseCanUseGlobalState & 1);
  return;
}

Assistant:

void ImGui_ImplSDL2_SaveState(int id) {
    auto & dst = g_state[id];

    dst.Window                          = g_Window;
    dst.Time                            = g_Time;
    dst.MousePressed[0]                 = g_MousePressed[0];
    dst.MousePressed[1]                 = g_MousePressed[1];
    dst.MousePressed[2]                 = g_MousePressed[2];
    for (int i = 0; i < ImGuiMouseCursor_COUNT; ++i) {
        dst.MouseCursors[i]                 = g_MouseCursors[i];
    }
    dst.ClipboardTextData               = g_ClipboardTextData;
    dst.MouseCanUseGlobalState          = g_MouseCanUseGlobalState;
}